

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O1

void __thiscall foxxll::linuxaio_queue::post_requests(linuxaio_queue *this)

{
  value_type vVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  pointer pCVar4;
  pointer pCVar5;
  _List_node_base *this_00;
  bool bVar6;
  __pid_t _Var7;
  io_event *events;
  void *pvVar8;
  linuxaio_request *this_01;
  iocb *piVar9;
  long lVar10;
  int *piVar11;
  ostream *poVar12;
  char *pcVar13;
  io_error *piVar14;
  __sighandler_t __handler;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *this_02;
  Semaphore *this_03;
  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  reqs;
  request_ptr req;
  unique_lock<std::mutex> lock;
  request_ptr req_1;
  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  local_238;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_218;
  void *local_210;
  Semaphore *local_208;
  unique_lock<std::mutex> local_200;
  Semaphore *local_1f0;
  mutex *local_1e8;
  _List_node_base *local_1e0;
  request *local_1d8;
  Semaphore *local_1d0;
  string local_1c8;
  unique_lock<std::mutex> local_1a8 [23];
  
  iVar16 = this->max_events_;
  if ((long)iVar16 == 0) {
    events = (io_event *)0x0;
  }
  else {
    uVar15 = 0xffffffffffffffff;
    if (-1 < iVar16) {
      uVar15 = (long)iVar16 << 5;
    }
    events = (io_event *)operator_new__(uVar15);
  }
  this_03 = &this->num_waiting_requests_;
  local_1d8 = (request *)&this->post_thread_state_;
  local_1e8 = &this->waiting_mtx_;
  local_1e0 = (_List_node_base *)&this->waiting_requests_;
  local_208 = &this->num_free_events_;
  local_1d0 = &this->num_posted_requests_;
  local_1f0 = this_03;
  do {
    iVar16 = 1;
    _Var7 = tlx::Semaphore::wait(this_03,(void *)0x1);
    local_1a8[0]._M_device = (mutex_type *)local_1d8;
    local_1a8[0]._M_owns = false;
    std::unique_lock<std::mutex>::lock(local_1a8);
    local_1a8[0]._M_owns = true;
    vVar1 = (this->post_thread_state_).state_;
    std::unique_lock<std::mutex>::~unique_lock(local_1a8);
    this_00 = local_1e0;
    bVar3 = vVar1 == TERMINATING;
    if (_Var7 == 0 && bVar3) break;
    local_200._M_device = local_1e8;
    local_200._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_200);
    local_200._M_owns = true;
    p_Var2 = (((_List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                *)&this_00->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == this_00) {
      std::unique_lock<std::mutex>::unlock(&local_200);
      tlx::Semaphore::signal(this_03,iVar16,__handler_01);
    }
    else {
      local_238.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0;
      local_238.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0;
      local_238.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0;
      local_218.ptr_ = (request *)p_Var2[1]._M_next;
      if (local_218.ptr_ != (request *)0x0) {
        LOCK();
        ((local_218.ptr_)->super_reference_counter).reference_count_.
        super___atomic_base<unsigned_long>._M_i =
             (__int_type)
             ((long)&((_List_node_base *)
                     ((local_218.ptr_)->super_reference_counter).reference_count_.
                     super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
        UNLOCK();
      }
      std::__cxx11::
      list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::_M_erase((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  *)this_00,this_00->_M_next);
      if (local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
        ::_M_realloc_insert<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                  ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                    *)&local_238,
                   (iterator)
                   local_238.
                   super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_218);
      }
      else {
        (local_238.
         super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->ptr_ = local_218.ptr_;
        local_218.ptr_ = (request *)0x0;
        local_238.
        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_238.
             super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      while( true ) {
        if ((this_00->_M_next == this_00) ||
           (bVar6 = tlx::Semaphore::try_acquire(local_208,1,1), !bVar6)) goto LAB_0014925c;
        iVar16 = 1;
        bVar6 = tlx::Semaphore::try_acquire(this_03,1,0);
        if (!bVar6) break;
        local_1a8[0]._M_device = (mutex_type *)this_00->_M_next[1]._M_next;
        if ((request *)local_1a8[0]._M_device != (request *)0x0) {
          LOCK();
          (((request *)local_1a8[0]._M_device)->super_reference_counter).reference_count_.
          super___atomic_base<unsigned_long>._M_i =
               (__int_type)
               ((long)&((_List_node_base *)
                       (((request *)local_1a8[0]._M_device)->super_reference_counter).
                       reference_count_.super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
          UNLOCK();
        }
        std::__cxx11::
        list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ::_M_erase((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                    *)this_00,this_00->_M_next);
        if (local_238.
            super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_238.
            super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
          ::_M_realloc_insert<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                    ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                      *)&local_238,
                     (iterator)
                     local_238.
                     super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
        }
        else {
          (local_238.
           super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->ptr_ = (request *)local_1a8[0]._M_device;
          local_1a8[0]._M_device = (mutex_type *)0x0;
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_238.
               super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                  ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
      }
      tlx::Semaphore::signal(local_208,iVar16,__handler);
LAB_0014925c:
      std::unique_lock<std::mutex>::unlock(&local_200);
      tlx::Semaphore::wait(local_208,(void *)0x1);
      uVar15 = (long)local_238.
                     super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_238.
                     super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if ((long)local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = operator_new__(-(ulong)(uVar15 >> 0x3d != 0) |
                                (long)local_238.
                                      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_238.
                                      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar17 = 0;
        do {
          this_01 = (linuxaio_request *)
                    __dynamic_cast(local_238.
                                   super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar17].ptr_,
                                   &request::typeinfo,&linuxaio_request::typeinfo,0);
          piVar9 = linuxaio_request::fill_control_block(this_01);
          *(iocb **)((long)pvVar8 + uVar17 * 8) = piVar9;
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)local_238.
                                        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_238.
                                        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pCVar5 = local_238.
               super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar4 = local_238.
               super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_02 = local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(this_02);
          this_02 = this_02 + 1;
        } while (this_02 != pCVar5);
        local_238.
        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar4;
      }
      uVar17 = 0;
      local_210 = pvVar8;
      do {
        if (uVar15 < uVar17 || uVar15 - uVar17 == 0) break;
        lVar10 = syscall(0xd1,this->context_,uVar15 - uVar17,(void *)(uVar17 * 8 + (long)local_210))
        ;
        __handler_00 = extraout_RDX;
        if ((lVar10 < 1) &&
           (piVar11 = __errno_location(), __handler_00 = extraout_RDX_00, *piVar11 != 0xb)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"void foxxll::linuxaio_queue::post_requests()",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"linuxaio_request::post io_submit()",0x22);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
          pcVar13 = strerror(*piVar11);
          std::operator<<((ostream *)local_1a8,pcVar13);
          piVar14 = (io_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::stringbuf::str();
          io_error::io_error(piVar14,&local_1c8);
          __cxa_throw(piVar14,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
        }
        if (lVar10 < 1) {
LAB_0014938b:
          lVar10 = syscall(0xd0,this->context_,0,(ulong)(uint)this->max_events_,events,0);
          if (lVar10 < 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"void foxxll::linuxaio_queue::post_requests()",0x2c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "linuxaio_queue::post_requests io_getevents() nr_events=",0x37);
            poVar12 = std::ostream::_M_insert<long>((long)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," : ",3);
            piVar11 = __errno_location();
            pcVar13 = strerror(*piVar11);
            std::operator<<(poVar12,pcVar13);
            piVar14 = (io_error *)__cxa_allocate_exception(0x20);
            std::__cxx11::stringbuf::str();
            io_error::io_error(piVar14,&local_1c8);
            __cxa_throw(piVar14,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
          }
          bVar6 = true;
          if (lVar10 != 0) {
            handle_events(this,events,lVar10,false);
          }
        }
        else {
          tlx::Semaphore::signal(local_1d0,(int)lVar10,__handler_00);
          uVar17 = lVar10 + uVar17;
          if (uVar17 != uVar15) goto LAB_0014938b;
          bVar6 = false;
        }
      } while (bVar6);
      if (local_210 != (void *)0x0) {
        operator_delete__(local_210);
      }
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&local_218);
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::~vector(&local_238);
      this_03 = local_1f0;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_200);
  } while (_Var7 != 0 || !bVar3);
  if (events != (io_event *)0x0) {
    operator_delete__(events);
  }
  return;
}

Assistant:

void linuxaio_queue::post_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // block until next request or message comes in
        int num_currently_waiting_requests = num_waiting_requests_.wait();

        // terminate if termination has been requested
        if (post_thread_state_() == TERMINATING &&
            num_currently_waiting_requests == 0)
            break;

        std::unique_lock<std::mutex> lock(waiting_mtx_);
        if (TLX_UNLIKELY(waiting_requests_.empty())) {
            // unlock queue
            lock.unlock();

            // num_waiting_requests_-- was premature, compensate for that
            num_waiting_requests_.signal();
            continue;
        }

        // collect requests from waiting queue: first is there
        std::vector<request_ptr> reqs;

        request_ptr req = waiting_requests_.front();
        waiting_requests_.pop_front();
        reqs.emplace_back(std::move(req));

        // collect additional requests
        while (!waiting_requests_.empty()) {
            // acquire one free event, but keep one in slack
            if (!num_free_events_.try_acquire(/* delta */ 1, /* slack */ 1))
                break;
            if (!num_waiting_requests_.try_acquire()) {
                num_free_events_.signal();
                break;
            }

            request_ptr req = waiting_requests_.front();
            waiting_requests_.pop_front();
            reqs.emplace_back(std::move(req));
        }

        lock.unlock();

        // the last free_event must be acquired outside of the lock.
        num_free_events_.wait();

        // construct batch iocb
        tlx::simple_vector<iocb*> cbs(reqs.size());

        for (size_t i = 0; i < reqs.size(); ++i) {
            // polymorphic_downcast
            auto ar = dynamic_cast<linuxaio_request*>(reqs[i].get());
            cbs[i] = ar->fill_control_block();
        }
        reqs.clear();

        // io_submit loop
        size_t cb_done = 0;
        while (cb_done < cbs.size()) {
            long success = syscall(
                    SYS_io_submit, context_,
                    cbs.size() - cb_done,
                    cbs.data() + cb_done
                );

            if (success <= 0 && errno != EAGAIN) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_request::post io_submit()"
                );
            }
            if (success > 0) {
                // request is posted
                num_posted_requests_.signal(success);

                cb_done += success;
                if (cb_done == cbs.size())
                    break;
            }

            // post failed, so first handle events to make queues (more) empty,
            // then try again.

            // wait for at least one event to complete, no time limit
            long num_events = syscall(
                    SYS_io_getevents, context_, 0,
                    max_events_, events.data(), nullptr
                );
            if (num_events < 0) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::post_requests"
                    " io_getevents() nr_events=" << num_events
                );
            }
            if (num_events > 0)
                handle_events(events.data(), num_events, false);
        }
    }
}